

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void QGraphicsViewPrivate::translateTouchEvent(QGraphicsViewPrivate *d,QTouchEvent *touchEvent)

{
  long lVar1;
  QPointF arg;
  qsizetype qVar2;
  QGraphicsViewPrivate *pQVar3;
  longlong in_RSI;
  qreal in_RDI;
  long in_FS_OFFSET;
  QEventPoint *pt;
  int i;
  QEventPoint *in_stack_ffffffffffffff98;
  qreal qVar4;
  QPointF in_stack_ffffffffffffffb8;
  QPointF *point;
  QGraphicsViewPrivate *this;
  undefined4 local_2c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = 0;
  while( true ) {
    point = (QPointF *)in_stack_ffffffffffffffb8.yp;
    qVar2 = QPointerEvent::pointCount((QPointerEvent *)0xa311ec);
    if (qVar2 <= local_2c) break;
    pQVar3 = (QGraphicsViewPrivate *)QPointerEvent::point(in_RSI);
    qVar4 = in_RDI;
    this = pQVar3;
    QEventPoint::position();
    in_stack_ffffffffffffffb8 = mapToScene(this,point);
    arg.yp = (qreal)pQVar3;
    arg.xp = qVar4;
    QMutableEventPoint::setScenePosition(in_stack_ffffffffffffff98,arg);
    local_2c = local_2c + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsViewPrivate::translateTouchEvent(QGraphicsViewPrivate *d, QTouchEvent *touchEvent)
{
    for (int i = 0; i < touchEvent->pointCount(); ++i) {
        auto &pt = touchEvent->point(i);
        // the scene will set the item local pos, startPos, lastPos, and rect before delivering to
        // an item, but for now those functions are returning the view's local coordinates
        QMutableEventPoint::setScenePosition(pt, d->mapToScene(pt.position()));
        // screenPos, startScreenPos, and lastScreenPos are already set
    }
}